

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HashTable.h
# Opt level: O0

iterator * __thiscall
idx2::Delete<unsigned_long,idx2::brick_volume>
          (iterator *__return_storage_ptr__,idx2 *this,
          hash_table<unsigned_long,_idx2::brick_volume> *Ht,unsigned_long *Key)

{
  ulong uVar1;
  bool Found;
  i64 Start;
  i64 H;
  unsigned_long *Key_local;
  hash_table<unsigned_long,_idx2::brick_volume> *Ht_local;
  
  uVar1 = (ulong)((long)Ht->Keys * -0x61c8864680b583eb) >>
          (0x40U - (char)*(undefined8 *)(this + 0x20) & 0x3f);
  Start = uVar1;
  do {
    if (*(char *)(*(long *)(this + 0x10) + Start) == '\0') break;
    if (*(unsigned_long **)(*(long *)this + Start * 8) == Ht->Keys) {
      *(undefined1 *)(*(long *)(this + 0x10) + Start) = 1;
      *(long *)(this + 0x18) = *(long *)(this + 0x18) + -1;
      __return_storage_ptr__->Key = (unsigned_long *)(*(long *)this + Start * 8);
      __return_storage_ptr__->Val = (brick_volume *)(*(long *)(this + 8) + Start * 0x40);
      __return_storage_ptr__->Ht = (hash_table<unsigned_long,_idx2::brick_volume> *)this;
      __return_storage_ptr__->Idx = Start;
      return __return_storage_ptr__;
    }
    Start = (1L << ((byte)*(undefined8 *)(this + 0x20) & 0x3f)) - 1U & Start + 1U;
  } while (Start != uVar1);
  End<unsigned_long,idx2::brick_volume>
            (__return_storage_ptr__,this,(hash_table<unsigned_long,_idx2::brick_volume> *)this);
  return __return_storage_ptr__;
}

Assistant:

typename hash_table<k, v>::iterator
Delete(hash_table<k, v>* Ht, const k& Key)
{
  i64 H = Index(*Ht, Hash(Key));
  i64 Start = H;
  bool Found = false;
  while (Ht->Stats[H] != hash_table<k, v>::Empty)
  {
    if (Ht->Keys[H] == Key)
    {
      Ht->Stats[H] = hash_table<k, v>::Tombstone;
      --Ht->Size;
      idx2_Assert(Ht->Size >= 0);
      Found = true;
      return IterAt(*Ht, H);
    }
    ++H;
    if ((H &= Capacity(*Ht) - 1) == Start)
      break;
  }
  if (Found)
  {
    idx2_Assert(Ht->Keys[H] == Key);
  }
  idx2_Assert(Found);
  return End(*Ht);
}